

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-words.h
# Opt level: O2

shared_ptr<RoomBase> __thiscall RoomWords::getBash(RoomWords *this,Parameters *parameters)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _func_int *p_Var2;
  shared_ptr<RoomBase> sVar3;
  shared_ptr<RoomWords> result;
  _func_int **local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  std::make_shared<RoomWords>();
  *(undefined4 *)((long)local_60 + 0xc) = 0;
  std::__cxx11::string::assign((char *)(local_60 + 2));
  std::operator+(&local_50,&parameters->pathData,"words_bash.txt");
  Dictionary::load((Dictionary *)&local_30,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_60 + 0x19),&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined4 *)((long)local_60 + 0x34) = 0x20;
  p_Var2 = (_func_int *)anon_unknown.dwarf_11b02::timestamp_s();
  _Var1._M_pi = local_58._M_pi;
  local_60[7] = p_Var2;
  local_60[9] = (_func_int *)0x404e000000000000;
  local_60[8] = (_func_int *)((double)p_Var2 + -60.0);
  (this->super_RoomBase)._vptr_RoomBase = local_60;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_RoomBase).id = _Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  sVar3.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_RoomBase;
  return (shared_ptr<RoomBase>)sVar3.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<RoomBase> getBash(Parameters parameters) {
        auto result = std::make_shared<RoomWords>();

        result->mode = Standard;
        result->name = "Bash";
        result->dictionary = Dictionary::load(parameters.pathData + "words_bash.txt");
        result->poolSize = 32;
        result->tCreated_s = timestamp_s();
        result->tRoundLength_s = 1.0f*60.f;
        result->tRoundStart_s = result->tCreated_s - result->tRoundLength_s;

        return result;
    }